

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cc
# Opt level: O2

Point Text::extent(u16string *string)

{
  Point in_RAX;
  uint uVar1;
  u16string *__range1;
  long lVar2;
  uint uVar3;
  Point local_18;
  
  local_18 = in_RAX;
  Point::Point(&local_18);
  uVar1 = local_18.row;
  uVar3 = local_18.column;
  for (lVar2 = 0; string->_M_string_length * 2 != lVar2; lVar2 = lVar2 + 2) {
    if (*(short *)((long)(string->_M_dataplus)._M_p + lVar2) == 10) {
      uVar1 = uVar1 + 1;
      local_18.column = 0;
      local_18.row = uVar1;
      uVar3 = 0;
    }
    else {
      uVar3 = uVar3 + 1;
    }
    local_18.column = uVar3;
  }
  return local_18;
}

Assistant:

Point Text::extent(const std::u16string &string) {
  Point result;
  for (auto c : string) {
    if (c == '\n') {
      result.row++;
      result.column = 0;
    } else {
      result.column++;
    }
  }
  return result;
}